

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_column_data.cpp
# Opt level: O3

void __thiscall
duckdb::StandardColumnData::Select
          (StandardColumnData *this,TransactionData transaction,idx_t vector_index,
          ColumnScanState *state,Vector *result,SelectionVector *sel,idx_t sel_count)

{
  int iVar1;
  reference state_00;
  idx_t target_count;
  StandardColumnData *this_00;
  ColumnData *this_01;
  ulong uVar2;
  idx_t current_row;
  bool bVar3;
  bool bVar4;
  optional_ptr<const_duckdb::CompressionFunction,_true> validity_compression;
  optional_ptr<const_duckdb::CompressionFunction,_true> compression;
  __base_type local_58;
  __base_type local_50;
  DuckTransaction *local_48;
  transaction_t tStack_40;
  transaction_t local_38;
  
  local_50._M_p = (this->super_ColumnData).compression.ptr._M_b._M_p;
  bVar4 = true;
  bVar3 = true;
  if (local_50._M_p != (__pointer_type)0x0) {
    optional_ptr<const_duckdb::CompressionFunction,_true>::CheckValid
              ((optional_ptr<const_duckdb::CompressionFunction,_true> *)&local_50);
    bVar3 = (local_50._M_p)->select == (compression_select_t)0x0;
  }
  local_58._M_p = (this->validity).super_ColumnData.compression.ptr._M_b._M_p;
  if (local_58._M_p != (__pointer_type)0x0) {
    optional_ptr<const_duckdb::CompressionFunction,_true>::CheckValid
              ((optional_ptr<const_duckdb::CompressionFunction,_true> *)&local_58);
    bVar4 = (local_58._M_p)->select == (compression_select_t)0x0;
  }
  target_count = (this->super_ColumnData).count.super___atomic_base<unsigned_long>._M_i +
                 vector_index * -0x800;
  if (0x7ff < target_count) {
    target_count = 0x800;
  }
  this_00 = this;
  iVar1 = (*(this->super_ColumnData)._vptr_ColumnData[5])(this,state,target_count,result);
  if ((bVar3 || bVar4) || (iVar1 != 0)) {
    local_38 = transaction.start_time;
    local_48 = transaction.transaction.ptr;
    tStack_40 = transaction.transaction_id;
    uVar2 = (this->super_ColumnData).count.super___atomic_base<unsigned_long>._M_i +
            vector_index * -0x800;
    if (0x7ff < uVar2) {
      uVar2 = 0x800;
    }
    (*(this->super_ColumnData)._vptr_ColumnData[9])(this,vector_index,state,result,uVar2);
    Vector::Slice(result,sel,sel_count);
  }
  else {
    ColumnData::SelectVector(&this_00->super_ColumnData,state,result,target_count,sel,sel_count);
    this_01 = (ColumnData *)&state->child_states;
    state_00 = vector<duckdb::ColumnScanState,_true>::operator[]
                         ((vector<duckdb::ColumnScanState,_true> *)this_01,0);
    ColumnData::SelectVector(this_01,state_00,result,target_count,sel,sel_count);
  }
  return;
}

Assistant:

void StandardColumnData::Select(TransactionData transaction, idx_t vector_index, ColumnScanState &state, Vector &result,
                                SelectionVector &sel, idx_t sel_count) {
	// check if we can do a specialized select
	// the compression functions need to support this
	auto compression = GetCompressionFunction();
	bool has_select = compression && compression->select;
	auto validity_compression = validity.GetCompressionFunction();
	bool validity_has_select = validity_compression && validity_compression->select;
	auto target_count = GetVectorCount(vector_index);
	auto scan_type = GetVectorScanType(state, target_count, result);
	bool scan_entire_vector = scan_type == ScanVectorType::SCAN_ENTIRE_VECTOR;
	if (!has_select || !validity_has_select || !scan_entire_vector) {
		// we are not scanning an entire vector - this can have several causes (updates, etc)
		ColumnData::Select(transaction, vector_index, state, result, sel, sel_count);
		return;
	}
	SelectVector(state, result, target_count, sel, sel_count);
	validity.SelectVector(state.child_states[0], result, target_count, sel, sel_count);
}